

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

bool embree::avx512::
     BVHNIntersector1<8,_1,_false,_embree::avx512::SubGridIntersector1Moeller<8,_true>_>::pointQuery
               (Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  float *pfVar1;
  ulong *puVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined4 uVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  uint uVar12;
  uint uVar13;
  Geometry *this;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  byte bVar26;
  long lVar27;
  ulong uVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  bool bVar33;
  bool bVar34;
  byte bVar35;
  long lVar36;
  byte bVar37;
  long lVar38;
  ulong *puVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  float fVar52;
  undefined1 auVar53 [16];
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [16];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [64];
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2538 [16];
  float local_2518;
  float fStack_2514;
  float fStack_2510;
  float fStack_250c;
  float fStack_2508;
  float fStack_2504;
  float fStack_2500;
  float fStack_24fc;
  float local_24f8;
  float fStack_24f4;
  float fStack_24f0;
  float fStack_24ec;
  float fStack_24e8;
  float fStack_24e4;
  float fStack_24e0;
  float fStack_24dc;
  ulong local_2378;
  undefined4 local_2370 [2];
  ulong local_2368 [1127];
  undefined1 auVar45 [32];
  undefined1 auVar85 [64];
  
  local_2378 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_2378 == 8) {
    bVar33 = false;
  }
  else {
    local_2370[0] = 0;
    fVar52 = *(float *)&(context->query_radius).field_0;
    auVar79 = ZEXT3264(CONCAT428(fVar52,CONCAT424(fVar52,CONCAT420(fVar52,CONCAT416(fVar52,CONCAT412
                                                  (fVar52,CONCAT48(fVar52,CONCAT44(fVar52,fVar52))))
                                                  ))));
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      local_2538 = ZEXT416((uint)(query->radius * query->radius));
    }
    else {
      aVar7 = (context->query_radius).field_0;
      local_2538 = vdpps_avx((undefined1  [16])aVar7,(undefined1  [16])aVar7,0x7f);
    }
    puVar39 = local_2368;
    fVar3 = (query->p).field_0.field_0.x;
    auVar80._4_4_ = fVar3;
    auVar80._0_4_ = fVar3;
    auVar80._8_4_ = fVar3;
    auVar80._12_4_ = fVar3;
    auVar80._16_4_ = fVar3;
    auVar80._20_4_ = fVar3;
    auVar80._24_4_ = fVar3;
    auVar80._28_4_ = fVar3;
    fVar4 = (query->p).field_0.field_0.y;
    auVar81._4_4_ = fVar4;
    auVar81._0_4_ = fVar4;
    auVar81._8_4_ = fVar4;
    auVar81._12_4_ = fVar4;
    auVar81._16_4_ = fVar4;
    auVar81._20_4_ = fVar4;
    auVar81._24_4_ = fVar4;
    auVar81._28_4_ = fVar4;
    fVar5 = (query->p).field_0.field_0.z;
    auVar82._4_4_ = fVar5;
    auVar82._0_4_ = fVar5;
    auVar82._8_4_ = fVar5;
    auVar82._12_4_ = fVar5;
    auVar82._16_4_ = fVar5;
    auVar82._20_4_ = fVar5;
    auVar82._24_4_ = fVar5;
    auVar82._28_4_ = fVar5;
    local_24f8 = (context->query_radius).field_0.m128[1];
    local_2518 = (context->query_radius).field_0.m128[2];
    fVar52 = fVar52 * fVar52;
    auVar83._4_4_ = fVar52;
    auVar83._0_4_ = fVar52;
    auVar83._8_4_ = fVar52;
    auVar83._12_4_ = fVar52;
    auVar83._16_4_ = fVar52;
    auVar83._20_4_ = fVar52;
    auVar83._24_4_ = fVar52;
    auVar83._28_4_ = fVar52;
    bVar33 = false;
    auVar78 = ZEXT3264(_DAT_01fe9900);
    auVar77 = ZEXT3264(CONCAT428(0xfffffff8,
                                 CONCAT424(0xfffffff8,
                                           CONCAT420(0xfffffff8,
                                                     CONCAT416(0xfffffff8,
                                                               CONCAT412(0xfffffff8,
                                                                         CONCAT48(0xfffffff8,
                                                                                  0xfffffff8fffffff8
                                                                                 )))))));
    fStack_2514 = local_2518;
    fStack_2510 = local_2518;
    fStack_250c = local_2518;
    fStack_2508 = local_2518;
    fStack_2504 = local_2518;
    fStack_2500 = local_2518;
    fStack_24fc = local_2518;
    fStack_24f4 = local_24f8;
    fStack_24f0 = local_24f8;
    fStack_24ec = local_24f8;
    fStack_24e8 = local_24f8;
    fStack_24e4 = local_24f8;
    fStack_24e0 = local_24f8;
    fStack_24dc = local_24f8;
    do {
      auVar84 = ZEXT3264(auVar83);
      auVar83 = vsubps_avx(auVar80,auVar79._0_32_);
      fVar52 = fVar3 + auVar79._0_4_;
      fVar59 = fVar3 + auVar79._4_4_;
      fVar60 = fVar3 + auVar79._8_4_;
      fVar61 = fVar3 + auVar79._12_4_;
      fVar62 = fVar3 + auVar79._16_4_;
      fVar63 = fVar3 + auVar79._20_4_;
      fVar64 = fVar3 + auVar79._24_4_;
      fVar65 = fVar3 + auVar79._28_4_;
      auVar14._4_4_ = fStack_24f4;
      auVar14._0_4_ = local_24f8;
      auVar14._8_4_ = fStack_24f0;
      auVar14._12_4_ = fStack_24ec;
      auVar14._16_4_ = fStack_24e8;
      auVar14._20_4_ = fStack_24e4;
      auVar14._24_4_ = fStack_24e0;
      auVar14._28_4_ = fStack_24dc;
      auVar14 = vsubps_avx(auVar81,auVar14);
      auVar15._4_4_ = fStack_2514;
      auVar15._0_4_ = local_2518;
      auVar15._8_4_ = fStack_2510;
      auVar15._12_4_ = fStack_250c;
      auVar15._16_4_ = fStack_2508;
      auVar15._20_4_ = fStack_2504;
      auVar15._24_4_ = fStack_2500;
      auVar15._28_4_ = fStack_24fc;
      auVar15 = vsubps_avx(auVar82,auVar15);
LAB_01f36721:
      pfVar1 = (float *)(puVar39 + -1);
      puVar39 = puVar39 + -2;
      if (*pfVar1 <= (float)local_2538._0_4_) {
        uVar40 = *puVar39;
        do {
          do {
            auVar46 = auVar84._0_32_;
            if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
              if ((uVar40 & 8) != 0) {
LAB_01f36bca:
                uVar42 = (ulong)((uint)uVar40 & 0xf);
                if (uVar42 != 8) {
                  bVar37 = 0;
                  lVar36 = 0;
                  do {
                    puVar2 = (ulong *)((uVar40 & 0xfffffffffffffff0) + 0x40 + lVar36 * 0x90);
                    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
                      uVar6 = (undefined4)puVar2[6];
                      auVar55._4_4_ = uVar6;
                      auVar55._0_4_ = uVar6;
                      auVar55._8_4_ = uVar6;
                      auVar55._12_4_ = uVar6;
                      auVar55._16_4_ = uVar6;
                      auVar55._20_4_ = uVar6;
                      auVar55._24_4_ = uVar6;
                      auVar55._28_4_ = uVar6;
                      uVar6 = *(undefined4 *)((long)puVar2 + 0x3c);
                      auVar67._4_4_ = uVar6;
                      auVar67._0_4_ = uVar6;
                      auVar67._8_4_ = uVar6;
                      auVar67._12_4_ = uVar6;
                      auVar67._16_4_ = uVar6;
                      auVar67._20_4_ = uVar6;
                      auVar67._24_4_ = uVar6;
                      auVar67._28_4_ = uVar6;
                      auVar70._8_8_ = 0;
                      auVar70._0_8_ = *puVar2;
                      auVar47 = vpmovzxbd_avx2(auVar70);
                      auVar47 = vcvtdq2ps_avx(auVar47);
                      auVar29 = vfmadd213ps_fma(auVar47,auVar67,auVar55);
                      auVar76._8_8_ = 0;
                      auVar76._0_8_ = puVar2[1];
                      auVar47 = vpmovzxbd_avx2(auVar76);
                      auVar47 = vcvtdq2ps_avx(auVar47);
                      auVar30 = vfmadd213ps_fma(auVar47,auVar67,auVar55);
                      uVar6 = *(undefined4 *)((long)puVar2 + 0x34);
                      auVar56._4_4_ = uVar6;
                      auVar56._0_4_ = uVar6;
                      auVar56._8_4_ = uVar6;
                      auVar56._12_4_ = uVar6;
                      auVar56._16_4_ = uVar6;
                      auVar56._20_4_ = uVar6;
                      auVar56._24_4_ = uVar6;
                      auVar56._28_4_ = uVar6;
                      uVar6 = (undefined4)puVar2[8];
                      auVar68._4_4_ = uVar6;
                      auVar68._0_4_ = uVar6;
                      auVar68._8_4_ = uVar6;
                      auVar68._12_4_ = uVar6;
                      auVar68._16_4_ = uVar6;
                      auVar68._20_4_ = uVar6;
                      auVar68._24_4_ = uVar6;
                      auVar68._28_4_ = uVar6;
                      auVar8._8_8_ = 0;
                      auVar8._0_8_ = puVar2[2];
                      auVar47 = vpmovzxbd_avx2(auVar8);
                      auVar47 = vcvtdq2ps_avx(auVar47);
                      auVar31 = vfmadd213ps_fma(auVar47,auVar68,auVar56);
                      auVar9._8_8_ = 0;
                      auVar9._0_8_ = puVar2[3];
                      auVar47 = vpmovzxbd_avx2(auVar9);
                      auVar47 = vcvtdq2ps_avx(auVar47);
                      auVar32 = vfmadd213ps_fma(auVar47,auVar68,auVar56);
                      uVar6 = (undefined4)puVar2[7];
                      auVar57._4_4_ = uVar6;
                      auVar57._0_4_ = uVar6;
                      auVar57._8_4_ = uVar6;
                      auVar57._12_4_ = uVar6;
                      auVar57._16_4_ = uVar6;
                      auVar57._20_4_ = uVar6;
                      auVar57._24_4_ = uVar6;
                      auVar57._28_4_ = uVar6;
                      uVar6 = *(undefined4 *)((long)puVar2 + 0x44);
                      auVar69._4_4_ = uVar6;
                      auVar69._0_4_ = uVar6;
                      auVar69._8_4_ = uVar6;
                      auVar69._12_4_ = uVar6;
                      auVar69._16_4_ = uVar6;
                      auVar69._20_4_ = uVar6;
                      auVar69._24_4_ = uVar6;
                      auVar69._28_4_ = uVar6;
                      auVar10._8_8_ = 0;
                      auVar10._0_8_ = puVar2[4];
                      auVar47 = vpmovzxbd_avx2(auVar10);
                      auVar47 = vcvtdq2ps_avx(auVar47);
                      auVar53 = vfmadd213ps_fma(auVar47,auVar69,auVar57);
                      auVar11._8_8_ = 0;
                      auVar11._0_8_ = puVar2[5];
                      auVar47 = vpmovzxbd_avx2(auVar11);
                      auVar47 = vcvtdq2ps_avx(auVar47);
                      auVar66 = vfmadd213ps_fma(auVar47,auVar69,auVar57);
                      auVar47 = vmaxps_avx(auVar80,ZEXT1632(auVar29));
                      auVar47 = vminps_avx(auVar47,ZEXT1632(auVar30));
                      auVar16 = vsubps_avx(auVar47,auVar80);
                      auVar47 = vmaxps_avx(auVar81,ZEXT1632(auVar31));
                      auVar47 = vminps_avx(auVar47,ZEXT1632(auVar32));
                      auVar43 = vsubps_avx(auVar47,auVar81);
                      auVar47 = vmaxps_avx(auVar82,ZEXT1632(auVar53));
                      auVar47 = vminps_avx(auVar47,ZEXT1632(auVar66));
                      auVar47 = vsubps_avx(auVar47,auVar82);
                      auVar58._0_4_ =
                           auVar16._0_4_ * auVar16._0_4_ + auVar43._0_4_ * auVar43._0_4_ +
                           auVar47._0_4_ * auVar47._0_4_;
                      auVar58._4_4_ =
                           auVar16._4_4_ * auVar16._4_4_ + auVar43._4_4_ * auVar43._4_4_ +
                           auVar47._4_4_ * auVar47._4_4_;
                      auVar58._8_4_ =
                           auVar16._8_4_ * auVar16._8_4_ + auVar43._8_4_ * auVar43._8_4_ +
                           auVar47._8_4_ * auVar47._8_4_;
                      auVar58._12_4_ =
                           auVar16._12_4_ * auVar16._12_4_ + auVar43._12_4_ * auVar43._12_4_ +
                           auVar47._12_4_ * auVar47._12_4_;
                      auVar58._16_4_ =
                           auVar16._16_4_ * auVar16._16_4_ + auVar43._16_4_ * auVar43._16_4_ +
                           auVar47._16_4_ * auVar47._16_4_;
                      auVar58._20_4_ =
                           auVar16._20_4_ * auVar16._20_4_ + auVar43._20_4_ * auVar43._20_4_ +
                           auVar47._20_4_ * auVar47._20_4_;
                      auVar58._24_4_ =
                           auVar16._24_4_ * auVar16._24_4_ + auVar43._24_4_ * auVar43._24_4_ +
                           auVar47._24_4_ * auVar47._24_4_;
                      auVar58._28_4_ = auVar16._28_4_ + auVar43._28_4_ + auVar43._28_4_;
                      uVar25 = vcmpps_avx512vl(ZEXT1632(auVar29),ZEXT1632(auVar30),2);
                      uVar23 = vpcmpub_avx512vl(auVar70,auVar76,2);
                      uVar18 = vcmpps_avx512vl(auVar58,auVar84._0_32_,2);
                      bVar35 = (byte)uVar25 & (byte)uVar18 & (byte)uVar23;
                    }
                    else {
                      auVar53._8_8_ = 0;
                      auVar53._0_8_ = *puVar2;
                      auVar66._8_8_ = 0;
                      auVar66._0_8_ = puVar2[1];
                      uVar24 = vpcmpub_avx512vl(auVar53,auVar66,2);
                      uVar6 = (undefined4)puVar2[6];
                      auVar49._4_4_ = uVar6;
                      auVar49._0_4_ = uVar6;
                      auVar49._8_4_ = uVar6;
                      auVar49._12_4_ = uVar6;
                      auVar49._16_4_ = uVar6;
                      auVar49._20_4_ = uVar6;
                      auVar49._24_4_ = uVar6;
                      auVar49._28_4_ = uVar6;
                      uVar6 = *(undefined4 *)((long)puVar2 + 0x3c);
                      auVar73._4_4_ = uVar6;
                      auVar73._0_4_ = uVar6;
                      auVar73._8_4_ = uVar6;
                      auVar73._12_4_ = uVar6;
                      auVar73._16_4_ = uVar6;
                      auVar73._20_4_ = uVar6;
                      auVar73._24_4_ = uVar6;
                      auVar73._28_4_ = uVar6;
                      auVar47 = vpmovzxbd_avx2(auVar53);
                      auVar47 = vcvtdq2ps_avx(auVar47);
                      auVar53 = vfmadd213ps_fma(auVar47,auVar73,auVar49);
                      auVar47 = vpmovzxbd_avx2(auVar66);
                      auVar47 = vcvtdq2ps_avx(auVar47);
                      auVar66 = vfmadd213ps_fma(auVar47,auVar73,auVar49);
                      uVar6 = *(undefined4 *)((long)puVar2 + 0x34);
                      auVar48._4_4_ = uVar6;
                      auVar48._0_4_ = uVar6;
                      auVar48._8_4_ = uVar6;
                      auVar48._12_4_ = uVar6;
                      auVar48._16_4_ = uVar6;
                      auVar48._20_4_ = uVar6;
                      auVar48._24_4_ = uVar6;
                      auVar48._28_4_ = uVar6;
                      uVar6 = (undefined4)puVar2[8];
                      auVar74._4_4_ = uVar6;
                      auVar74._0_4_ = uVar6;
                      auVar74._8_4_ = uVar6;
                      auVar74._12_4_ = uVar6;
                      auVar74._16_4_ = uVar6;
                      auVar74._20_4_ = uVar6;
                      auVar74._24_4_ = uVar6;
                      auVar74._28_4_ = uVar6;
                      auVar29._8_8_ = 0;
                      auVar29._0_8_ = puVar2[2];
                      auVar47 = vpmovzxbd_avx2(auVar29);
                      auVar47 = vcvtdq2ps_avx(auVar47);
                      auVar29 = vfmadd213ps_fma(auVar47,auVar74,auVar48);
                      auVar30._8_8_ = 0;
                      auVar30._0_8_ = puVar2[3];
                      auVar47 = vpmovzxbd_avx2(auVar30);
                      auVar47 = vcvtdq2ps_avx(auVar47);
                      auVar30 = vfmadd213ps_fma(auVar47,auVar74,auVar48);
                      uVar6 = (undefined4)puVar2[7];
                      auVar71._4_4_ = uVar6;
                      auVar71._0_4_ = uVar6;
                      auVar71._8_4_ = uVar6;
                      auVar71._12_4_ = uVar6;
                      auVar71._16_4_ = uVar6;
                      auVar71._20_4_ = uVar6;
                      auVar71._24_4_ = uVar6;
                      auVar71._28_4_ = uVar6;
                      uVar6 = *(undefined4 *)((long)puVar2 + 0x44);
                      auVar75._4_4_ = uVar6;
                      auVar75._0_4_ = uVar6;
                      auVar75._8_4_ = uVar6;
                      auVar75._12_4_ = uVar6;
                      auVar75._16_4_ = uVar6;
                      auVar75._20_4_ = uVar6;
                      auVar75._24_4_ = uVar6;
                      auVar75._28_4_ = uVar6;
                      auVar31._8_8_ = 0;
                      auVar31._0_8_ = puVar2[4];
                      auVar47 = vpmovzxbd_avx2(auVar31);
                      auVar47 = vcvtdq2ps_avx(auVar47);
                      auVar31 = vfmadd213ps_fma(auVar47,auVar75,auVar71);
                      auVar32._8_8_ = 0;
                      auVar32._0_8_ = puVar2[5];
                      auVar47 = vpmovzxbd_avx2(auVar32);
                      auVar47 = vcvtdq2ps_avx(auVar47);
                      auVar32 = vfmadd213ps_fma(auVar47,auVar75,auVar71);
                      uVar25 = vcmpps_avx512vl(ZEXT1632(auVar66),auVar83,1);
                      auVar17._4_4_ = fVar59;
                      auVar17._0_4_ = fVar52;
                      auVar17._8_4_ = fVar60;
                      auVar17._12_4_ = fVar61;
                      auVar17._16_4_ = fVar62;
                      auVar17._20_4_ = fVar63;
                      auVar17._24_4_ = fVar64;
                      auVar17._28_4_ = fVar65;
                      uVar18 = vcmpps_avx512vl(ZEXT1632(auVar53),auVar17,6);
                      auVar50._4_4_ = fVar4 + fStack_24f4;
                      auVar50._0_4_ = fVar4 + local_24f8;
                      auVar50._8_4_ = fVar4 + fStack_24f0;
                      auVar50._12_4_ = fVar4 + fStack_24ec;
                      auVar50._16_4_ = fVar4 + fStack_24e8;
                      auVar50._20_4_ = fVar4 + fStack_24e4;
                      auVar50._24_4_ = fVar4 + fStack_24e0;
                      auVar50._28_4_ = fVar4 + fStack_24dc;
                      uVar23 = vcmpps_avx512vl(ZEXT1632(auVar29),auVar50,6);
                      uVar19 = vcmpps_avx512vl(ZEXT1632(auVar30),auVar14,1);
                      uVar20 = vcmpps_avx512vl(ZEXT1632(auVar32),auVar15,1);
                      auVar44._4_4_ = fVar5 + fStack_2514;
                      auVar44._0_4_ = fVar5 + local_2518;
                      auVar44._8_4_ = fVar5 + fStack_2510;
                      auVar44._12_4_ = fVar5 + fStack_250c;
                      auVar44._16_4_ = fVar5 + fStack_2508;
                      auVar44._20_4_ = fVar5 + fStack_2504;
                      auVar44._24_4_ = fVar5 + fStack_2500;
                      auVar44._28_4_ = fVar5 + fStack_24fc;
                      uVar21 = vcmpps_avx512vl(ZEXT1632(auVar31),auVar44,6);
                      uVar22 = vcmpps_avx512vl(ZEXT1632(auVar53),ZEXT1632(auVar66),2);
                      bVar35 = (byte)uVar24 & (byte)uVar22 &
                               ~((byte)uVar18 | (byte)uVar25 | (byte)uVar23 |
                                 (byte)uVar19 | (byte)uVar21 | (byte)uVar20);
                    }
                    if (bVar35 != 0) {
                      uVar41 = (ulong)bVar35;
                      lVar38 = lVar36 * 0x90 + (uVar40 & 0xfffffffffffffff0);
                      do {
                        lVar27 = 0;
                        for (uVar28 = uVar41; (uVar28 & 1) == 0;
                            uVar28 = uVar28 >> 1 | 0x8000000000000000) {
                          lVar27 = lVar27 + 1;
                        }
                        uVar12 = *(uint *)(lVar38 + 0x88);
                        uVar13 = *(uint *)(lVar38 + 4 + lVar27 * 8);
                        this = (context->scene->geometries).items[uVar12].ptr;
                        context->geomID = uVar12;
                        context->primID = uVar13;
                        bVar34 = Geometry::pointQuery(this,query,context);
                        bVar37 = bVar37 | bVar34;
                        uVar41 = uVar41 - 1 & uVar41;
                      } while (uVar41 != 0);
                    }
                    lVar36 = lVar36 + 1;
                    auVar84 = ZEXT3264(auVar46);
                  } while (lVar36 != uVar42 - 8);
                  if (bVar37 == 0) {
                    auVar79 = ZEXT3264(auVar79._0_32_);
                    auVar78 = ZEXT3264(_DAT_01fe9900);
                    auVar77 = ZEXT3264(CONCAT428(0xfffffff8,
                                                 CONCAT424(0xfffffff8,
                                                           CONCAT420(0xfffffff8,
                                                                     CONCAT416(0xfffffff8,
                                                                               CONCAT412(0xfffffff8,
                                                                                         CONCAT48(
                                                  0xfffffff8,0xfffffff8fffffff8)))))));
                  }
                  else {
                    uVar6 = *(undefined4 *)&(context->query_radius).field_0;
                    auVar79 = ZEXT3264(CONCAT428(uVar6,CONCAT424(uVar6,CONCAT420(uVar6,CONCAT416(
                                                  uVar6,CONCAT412(uVar6,CONCAT48(uVar6,CONCAT44(
                                                  uVar6,uVar6))))))));
                    local_24f8 = (context->query_radius).field_0.m128[1];
                    local_2518 = (context->query_radius).field_0.m128[2];
                    auVar78 = ZEXT3264(_DAT_01fe9900);
                    auVar77 = ZEXT3264(CONCAT428(0xfffffff8,
                                                 CONCAT424(0xfffffff8,
                                                           CONCAT420(0xfffffff8,
                                                                     CONCAT416(0xfffffff8,
                                                                               CONCAT412(0xfffffff8,
                                                                                         CONCAT48(
                                                  0xfffffff8,0xfffffff8fffffff8)))))));
                    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
                      local_2538 = ZEXT416((uint)(query->radius * query->radius));
                    }
                    else {
                      aVar7 = (context->query_radius).field_0;
                      local_2538 = vdpps_avx((undefined1  [16])aVar7,(undefined1  [16])aVar7,0x7f);
                    }
                    bVar33 = true;
                    fStack_2514 = local_2518;
                    fStack_2510 = local_2518;
                    fStack_250c = local_2518;
                    fStack_2508 = local_2518;
                    fStack_2504 = local_2518;
                    fStack_2500 = local_2518;
                    fStack_24fc = local_2518;
                    fStack_24f4 = local_24f8;
                    fStack_24f0 = local_24f8;
                    fStack_24ec = local_24f8;
                    fStack_24e8 = local_24f8;
                    fStack_24e4 = local_24f8;
                    fStack_24e0 = local_24f8;
                    fStack_24dc = local_24f8;
                  }
                }
                goto LAB_01f36f14;
              }
              auVar47 = vmaxps_avx(auVar80,*(undefined1 (*) [32])(uVar40 + 0x40));
              auVar47 = vminps_avx(auVar47,*(undefined1 (*) [32])(uVar40 + 0x60));
              auVar16 = vsubps_avx(auVar47,auVar80);
              auVar47 = vmaxps_avx(auVar81,*(undefined1 (*) [32])(uVar40 + 0x80));
              auVar47 = vminps_avx(auVar47,*(undefined1 (*) [32])(uVar40 + 0xa0));
              auVar43 = vsubps_avx(auVar47,auVar81);
              auVar47 = vmaxps_avx(auVar82,*(undefined1 (*) [32])(uVar40 + 0xc0));
              auVar47 = vminps_avx(auVar47,*(undefined1 (*) [32])(uVar40 + 0xe0));
              auVar47 = vsubps_avx(auVar47,auVar82);
              auVar54._0_4_ =
                   auVar16._0_4_ * auVar16._0_4_ + auVar43._0_4_ * auVar43._0_4_ +
                   auVar47._0_4_ * auVar47._0_4_;
              auVar54._4_4_ =
                   auVar16._4_4_ * auVar16._4_4_ + auVar43._4_4_ * auVar43._4_4_ +
                   auVar47._4_4_ * auVar47._4_4_;
              auVar54._8_4_ =
                   auVar16._8_4_ * auVar16._8_4_ + auVar43._8_4_ * auVar43._8_4_ +
                   auVar47._8_4_ * auVar47._8_4_;
              auVar54._12_4_ =
                   auVar16._12_4_ * auVar16._12_4_ + auVar43._12_4_ * auVar43._12_4_ +
                   auVar47._12_4_ * auVar47._12_4_;
              auVar54._16_4_ =
                   auVar16._16_4_ * auVar16._16_4_ + auVar43._16_4_ * auVar43._16_4_ +
                   auVar47._16_4_ * auVar47._16_4_;
              auVar54._20_4_ =
                   auVar16._20_4_ * auVar16._20_4_ + auVar43._20_4_ * auVar43._20_4_ +
                   auVar47._20_4_ * auVar47._20_4_;
              auVar54._24_4_ =
                   auVar16._24_4_ * auVar16._24_4_ + auVar43._24_4_ * auVar43._24_4_ +
                   auVar47._24_4_ * auVar47._24_4_;
              auVar54._28_4_ = auVar16._28_4_ + auVar43._28_4_ + auVar43._28_4_;
              uVar42 = vcmpps_avx512vl(auVar54,auVar46,2);
              uVar41 = vcmpps_avx512vl(*(undefined1 (*) [32])(uVar40 + 0x40),
                                       *(undefined1 (*) [32])(uVar40 + 0x60),2);
              uVar42 = uVar42 & uVar41;
            }
            else {
              if ((uVar40 & 8) != 0) goto LAB_01f36bca;
              auVar47 = *(undefined1 (*) [32])(uVar40 + 0x40);
              auVar16 = *(undefined1 (*) [32])(uVar40 + 0x60);
              auVar43 = vmaxps_avx(auVar80,auVar47);
              auVar43 = vminps_avx(auVar43,auVar16);
              auVar44 = vsubps_avx(auVar43,auVar80);
              auVar43 = vmaxps_avx(auVar81,*(undefined1 (*) [32])(uVar40 + 0x80));
              auVar43 = vminps_avx(auVar43,*(undefined1 (*) [32])(uVar40 + 0xa0));
              auVar50 = vsubps_avx(auVar43,auVar81);
              auVar43 = vmaxps_avx(auVar82,*(undefined1 (*) [32])(uVar40 + 0xc0));
              auVar43 = vminps_avx(auVar43,*(undefined1 (*) [32])(uVar40 + 0xe0));
              auVar43 = vsubps_avx(auVar43,auVar82);
              auVar78 = ZEXT3264(_DAT_01fe9900);
              auVar54._0_4_ =
                   auVar44._0_4_ * auVar44._0_4_ + auVar50._0_4_ * auVar50._0_4_ +
                   auVar43._0_4_ * auVar43._0_4_;
              auVar54._4_4_ =
                   auVar44._4_4_ * auVar44._4_4_ + auVar50._4_4_ * auVar50._4_4_ +
                   auVar43._4_4_ * auVar43._4_4_;
              auVar54._8_4_ =
                   auVar44._8_4_ * auVar44._8_4_ + auVar50._8_4_ * auVar50._8_4_ +
                   auVar43._8_4_ * auVar43._8_4_;
              auVar54._12_4_ =
                   auVar44._12_4_ * auVar44._12_4_ + auVar50._12_4_ * auVar50._12_4_ +
                   auVar43._12_4_ * auVar43._12_4_;
              auVar54._16_4_ =
                   auVar44._16_4_ * auVar44._16_4_ + auVar50._16_4_ * auVar50._16_4_ +
                   auVar43._16_4_ * auVar43._16_4_;
              auVar54._20_4_ =
                   auVar44._20_4_ * auVar44._20_4_ + auVar50._20_4_ * auVar50._20_4_ +
                   auVar43._20_4_ * auVar43._20_4_;
              auVar54._24_4_ =
                   auVar44._24_4_ * auVar44._24_4_ + auVar50._24_4_ * auVar50._24_4_ +
                   auVar43._24_4_ * auVar43._24_4_;
              auVar54._28_4_ = auVar44._28_4_ + auVar50._28_4_ + auVar50._28_4_;
              uVar25 = vcmpps_avx512vl(auVar47,auVar16,2);
              uVar18 = vcmpps_avx512vl(auVar16,auVar83,1);
              auVar43._4_4_ = fVar59;
              auVar43._0_4_ = fVar52;
              auVar43._8_4_ = fVar60;
              auVar43._12_4_ = fVar61;
              auVar43._16_4_ = fVar62;
              auVar43._20_4_ = fVar63;
              auVar43._24_4_ = fVar64;
              auVar43._28_4_ = fVar65;
              uVar23 = vcmpps_avx512vl(auVar47,auVar43,6);
              uVar19 = vcmpps_avx512vl(*(undefined1 (*) [32])(uVar40 + 0xa0),auVar14,1);
              auVar16._4_4_ = fVar4 + fStack_24f4;
              auVar16._0_4_ = fVar4 + local_24f8;
              auVar16._8_4_ = fVar4 + fStack_24f0;
              auVar16._12_4_ = fVar4 + fStack_24ec;
              auVar16._16_4_ = fVar4 + fStack_24e8;
              auVar16._20_4_ = fVar4 + fStack_24e4;
              auVar16._24_4_ = fVar4 + fStack_24e0;
              auVar16._28_4_ = fVar4 + fStack_24dc;
              uVar20 = vcmpps_avx512vl(*(undefined1 (*) [32])(uVar40 + 0x80),auVar16,6);
              uVar21 = vcmpps_avx512vl(*(undefined1 (*) [32])(uVar40 + 0xe0),auVar15,1);
              auVar77 = ZEXT3264(CONCAT428(0xfffffff8,
                                           CONCAT424(0xfffffff8,
                                                     CONCAT420(0xfffffff8,
                                                               CONCAT416(0xfffffff8,
                                                                         CONCAT412(0xfffffff8,
                                                                                   CONCAT48(
                                                  0xfffffff8,0xfffffff8fffffff8)))))));
              auVar47._4_4_ = fVar5 + fStack_2514;
              auVar47._0_4_ = fVar5 + local_2518;
              auVar47._8_4_ = fVar5 + fStack_2510;
              auVar47._12_4_ = fVar5 + fStack_250c;
              auVar47._16_4_ = fVar5 + fStack_2508;
              auVar47._20_4_ = fVar5 + fStack_2504;
              auVar47._24_4_ = fVar5 + fStack_2500;
              auVar47._28_4_ = fVar5 + fStack_24fc;
              uVar22 = vcmpps_avx512vl(*(undefined1 (*) [32])(uVar40 + 0xc0),auVar47,6);
              uVar42 = (ulong)(byte)(~((byte)uVar20 | (byte)uVar23 | (byte)uVar22 | (byte)uVar18 |
                                      (byte)uVar19 | (byte)uVar21) & (byte)uVar25);
            }
            bVar37 = (byte)uVar42;
            if (bVar37 == 0) {
              if (puVar39 == &local_2378) {
                return bVar33;
              }
              goto LAB_01f36721;
            }
            auVar47 = *(undefined1 (*) [32])(uVar40 & 0xfffffffffffffff0);
            auVar16 = ((undefined1 (*) [32])(uVar40 & 0xfffffffffffffff0))[1];
            auVar43 = vpternlogd_avx512vl(auVar78._0_32_,auVar54,auVar77._0_32_,0xf8);
            auVar44 = vpcompressd_avx512vl(auVar43);
            auVar45._0_4_ =
                 (uint)(bVar37 & 1) * auVar44._0_4_ | (uint)!(bool)(bVar37 & 1) * auVar43._0_4_;
            bVar34 = (bool)((byte)(uVar42 >> 1) & 1);
            auVar45._4_4_ = (uint)bVar34 * auVar44._4_4_ | (uint)!bVar34 * auVar43._4_4_;
            bVar34 = (bool)((byte)(uVar42 >> 2) & 1);
            auVar45._8_4_ = (uint)bVar34 * auVar44._8_4_ | (uint)!bVar34 * auVar43._8_4_;
            bVar34 = (bool)((byte)(uVar42 >> 3) & 1);
            auVar45._12_4_ = (uint)bVar34 * auVar44._12_4_ | (uint)!bVar34 * auVar43._12_4_;
            bVar34 = (bool)((byte)(uVar42 >> 4) & 1);
            auVar45._16_4_ = (uint)bVar34 * auVar44._16_4_ | (uint)!bVar34 * auVar43._16_4_;
            bVar34 = (bool)((byte)(uVar42 >> 5) & 1);
            auVar45._20_4_ = (uint)bVar34 * auVar44._20_4_ | (uint)!bVar34 * auVar43._20_4_;
            bVar34 = (bool)((byte)(uVar42 >> 6) & 1);
            auVar45._24_4_ = (uint)bVar34 * auVar44._24_4_ | (uint)!bVar34 * auVar43._24_4_;
            bVar34 = SUB81(uVar42 >> 7,0);
            auVar45._28_4_ = (uint)bVar34 * auVar44._28_4_ | (uint)!bVar34 * auVar43._28_4_;
            auVar43 = vpermt2q_avx512vl(auVar47,auVar45,auVar16);
            uVar40 = auVar43._0_8_;
            bVar37 = bVar37 - 1 & bVar37;
          } while (bVar37 == 0);
          auVar43 = vpshufd_avx2(auVar45,0x55);
          vpermt2q_avx512vl(auVar47,auVar43,auVar16);
          auVar44 = vpminsd_avx2(auVar45,auVar43);
          auVar43 = vpmaxsd_avx2(auVar45,auVar43);
          bVar37 = bVar37 - 1 & bVar37;
          if (bVar37 == 0) {
            auVar46 = vpermi2q_avx512vl(auVar44,auVar47,auVar16);
            uVar40 = auVar46._0_8_;
            auVar46 = vpermt2q_avx512vl(auVar47,auVar43,auVar16);
            *puVar39 = auVar46._0_8_;
            auVar46 = vpermd_avx2(auVar43,auVar54);
            *(int *)(puVar39 + 1) = auVar46._0_4_;
            puVar39 = puVar39 + 2;
          }
          else {
            auVar17 = vpshufd_avx2(auVar45,0xaa);
            vpermt2q_avx512vl(auVar47,auVar17,auVar16);
            auVar50 = vpminsd_avx2(auVar44,auVar17);
            auVar44 = vpmaxsd_avx2(auVar44,auVar17);
            auVar17 = vpminsd_avx2(auVar43,auVar44);
            auVar43 = vpmaxsd_avx2(auVar43,auVar44);
            bVar37 = bVar37 - 1 & bVar37;
            if (bVar37 == 0) {
              auVar46 = vpermi2q_avx512vl(auVar50,auVar47,auVar16);
              uVar40 = auVar46._0_8_;
              auVar46 = vpermt2q_avx512vl(auVar47,auVar43,auVar16);
              *puVar39 = auVar46._0_8_;
              auVar46 = vpermd_avx2(auVar43,auVar54);
              *(int *)(puVar39 + 1) = auVar46._0_4_;
              auVar46 = vpermt2q_avx512vl(auVar47,auVar17,auVar16);
              puVar39[2] = auVar46._0_8_;
              auVar46 = vpermd_avx2(auVar17,auVar54);
              *(int *)(puVar39 + 3) = auVar46._0_4_;
              puVar39 = puVar39 + 4;
              auVar77 = ZEXT3264(CONCAT428(0xfffffff8,
                                           CONCAT424(0xfffffff8,
                                                     CONCAT420(0xfffffff8,
                                                               CONCAT416(0xfffffff8,
                                                                         CONCAT412(0xfffffff8,
                                                                                   CONCAT48(
                                                  0xfffffff8,0xfffffff8fffffff8)))))));
            }
            else {
              auVar44 = vpshufd_avx2(auVar45,0xff);
              vpermt2q_avx512vl(auVar47,auVar44,auVar16);
              auVar49 = vpminsd_avx2(auVar50,auVar44);
              auVar44 = vpmaxsd_avx2(auVar50,auVar44);
              auVar50 = vpminsd_avx2(auVar17,auVar44);
              auVar44 = vpmaxsd_avx2(auVar17,auVar44);
              auVar17 = vpminsd_avx2(auVar43,auVar44);
              auVar43 = vpmaxsd_avx2(auVar43,auVar44);
              bVar37 = bVar37 - 1 & bVar37;
              if (bVar37 == 0) {
                auVar44 = vpermi2q_avx512vl(auVar49,auVar47,auVar16);
                uVar40 = auVar44._0_8_;
                auVar44 = vpermt2q_avx512vl(auVar47,auVar43,auVar16);
                *puVar39 = auVar44._0_8_;
                auVar43 = vpermd_avx2(auVar43,auVar54);
                *(int *)(puVar39 + 1) = auVar43._0_4_;
                auVar43 = vpermt2q_avx512vl(auVar47,auVar17,auVar16);
                puVar39[2] = auVar43._0_8_;
                auVar43 = vpermd_avx2(auVar17,auVar54);
                *(int *)(puVar39 + 3) = auVar43._0_4_;
                auVar47 = vpermt2q_avx512vl(auVar47,auVar50,auVar16);
                puVar39[4] = auVar47._0_8_;
                auVar47 = vpermd_avx2(auVar50,auVar54);
                *(int *)(puVar39 + 5) = auVar47._0_4_;
                puVar39 = puVar39 + 6;
              }
              else {
                auVar48 = valignd_avx512vl(auVar45,auVar45,3);
                auVar44 = vpmovsxbd_avx2(ZEXT816(0x303020108));
                auVar49 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                               CONCAT48(0x80000000,
                                                                        0x8000000080000000))),
                                            auVar44,auVar49);
                auVar44 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                auVar50 = vpermt2d_avx512vl(auVar49,auVar44,auVar50);
                auVar50 = vpermt2d_avx512vl(auVar50,auVar44,auVar17);
                auVar44 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                auVar43 = vpermt2d_avx512vl(auVar50,auVar44,auVar43);
                auVar77 = ZEXT3264(auVar43);
                bVar35 = bVar37;
                do {
                  auVar44 = auVar77._0_32_;
                  auVar72._8_4_ = 1;
                  auVar72._0_8_ = 0x100000001;
                  auVar72._12_4_ = 1;
                  auVar72._16_4_ = 1;
                  auVar72._20_4_ = 1;
                  auVar72._24_4_ = 1;
                  auVar72._28_4_ = 1;
                  auVar43 = vpermd_avx2(auVar72,auVar48);
                  auVar48 = valignd_avx512vl(auVar48,auVar48,1);
                  vpermt2q_avx512vl(auVar47,auVar48,auVar16);
                  bVar35 = bVar35 - 1 & bVar35;
                  uVar25 = vpcmpd_avx512vl(auVar43,auVar44,5);
                  auVar43 = vpmaxsd_avx2(auVar43,auVar44);
                  bVar26 = (byte)uVar25 << 1;
                  auVar44 = valignd_avx512vl(auVar44,auVar44,7);
                  bVar34 = (bool)((byte)uVar25 & 1);
                  auVar51._4_4_ = (uint)bVar34 * auVar44._4_4_ | (uint)!bVar34 * auVar43._4_4_;
                  auVar51._0_4_ = auVar43._0_4_;
                  bVar34 = (bool)(bVar26 >> 2 & 1);
                  auVar51._8_4_ = (uint)bVar34 * auVar44._8_4_ | (uint)!bVar34 * auVar43._8_4_;
                  bVar34 = (bool)(bVar26 >> 3 & 1);
                  auVar51._12_4_ = (uint)bVar34 * auVar44._12_4_ | (uint)!bVar34 * auVar43._12_4_;
                  bVar34 = (bool)(bVar26 >> 4 & 1);
                  auVar51._16_4_ = (uint)bVar34 * auVar44._16_4_ | (uint)!bVar34 * auVar43._16_4_;
                  bVar34 = (bool)(bVar26 >> 5 & 1);
                  auVar51._20_4_ = (uint)bVar34 * auVar44._20_4_ | (uint)!bVar34 * auVar43._20_4_;
                  bVar34 = (bool)(bVar26 >> 6 & 1);
                  auVar51._24_4_ = (uint)bVar34 * auVar44._24_4_ | (uint)!bVar34 * auVar43._24_4_;
                  auVar51._28_4_ =
                       (uint)(bVar26 >> 7) * auVar44._28_4_ |
                       (uint)!(bool)(bVar26 >> 7) * auVar43._28_4_;
                  auVar77 = ZEXT3264(auVar51);
                } while (bVar35 != 0);
                lVar36 = (ulong)(uint)POPCOUNT((uint)bVar37) + 3;
                do {
                  auVar43 = vpermi2q_avx512vl(auVar51,auVar47,auVar16);
                  *puVar39 = auVar43._0_8_;
                  auVar44 = auVar77._0_32_;
                  auVar43 = vpermd_avx2(auVar44,auVar54);
                  *(int *)(puVar39 + 1) = auVar43._0_4_;
                  auVar51 = valignd_avx512vl(auVar44,auVar44,1);
                  puVar39 = puVar39 + 2;
                  auVar77 = ZEXT3264(auVar51);
                  lVar36 = lVar36 + -1;
                } while (lVar36 != 0);
                auVar47 = vpermt2q_avx512vl(auVar47,auVar51,auVar16);
                uVar40 = auVar47._0_8_;
              }
              auVar78 = ZEXT3264(_DAT_01fe9900);
              auVar77 = ZEXT3264(CONCAT428(0xfffffff8,
                                           CONCAT424(0xfffffff8,
                                                     CONCAT420(0xfffffff8,
                                                               CONCAT416(0xfffffff8,
                                                                         CONCAT412(0xfffffff8,
                                                                                   CONCAT48(
                                                  0xfffffff8,0xfffffff8fffffff8)))))));
              auVar84 = ZEXT3264(auVar46);
            }
          }
        } while( true );
      }
LAB_01f36f14:
      auVar85._0_4_ = auVar79._0_4_ * auVar79._0_4_;
      auVar85._4_4_ = auVar79._4_4_ * auVar79._4_4_;
      auVar85._8_4_ = auVar79._8_4_ * auVar79._8_4_;
      auVar85._12_4_ = auVar79._12_4_ * auVar79._12_4_;
      auVar85._16_4_ = auVar79._16_4_ * auVar79._16_4_;
      auVar85._20_4_ = auVar79._20_4_ * auVar79._20_4_;
      auVar85._28_36_ = auVar84._28_36_;
      auVar85._24_4_ = auVar79._24_4_ * auVar79._24_4_;
      auVar83 = auVar85._0_32_;
    } while (puVar39 != &local_2378);
  }
  return bVar33;
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }